

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprSetHeight(Expr *p)

{
  u32 uVar1;
  int local_14;
  Expr *pEStack_10;
  int nHeight;
  Expr *p_local;
  
  local_14 = 0;
  pEStack_10 = p;
  heightOfExpr(p->pLeft,&local_14);
  heightOfExpr(pEStack_10->pRight,&local_14);
  if ((pEStack_10->flags & 0x800) == 0) {
    if ((pEStack_10->x).pList != (ExprList *)0x0) {
      heightOfExprList((pEStack_10->x).pList,&local_14);
      uVar1 = sqlite3ExprListFlags((pEStack_10->x).pList);
      pEStack_10->flags = uVar1 & 0x200104 | pEStack_10->flags;
    }
  }
  else {
    heightOfSelect((pEStack_10->x).pSelect,&local_14);
  }
  pEStack_10->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}